

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall MapLoader::setMapFile(MapLoader *this,string *newMapFile)

{
  string *this_00;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)newMapFile);
  this->pMapFile = this_00;
  return;
}

Assistant:

void MapLoader::setMapFile(std::string newMapFile) {
    pMapFile = new std::string(std::move(newMapFile));
}